

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O1

bool __thiscall duckdb::Binder::CTEIsAlreadyBound(Binder *this,CommonTableExpressionInfo *cte)

{
  bool bVar1;
  __node_base_ptr p_Var2;
  Binder *this_00;
  __hash_code __code;
  key_type local_18;
  
  local_18._M_data = cte;
  p_Var2 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::reference_wrapper<duckdb::CommonTableExpressionInfo>,_std::allocator<std::reference_wrapper<duckdb::CommonTableExpressionInfo>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::CommonTableExpressionInfo>,_duckdb::ReferenceHashFunction<duckdb::CommonTableExpressionInfo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(this->bound_ctes)._M_h,(ulong)cte % (this->bound_ctes)._M_h._M_bucket_count,
                      &local_18,(__hash_code)cte);
  if ((p_Var2 == (__node_base_ptr)0x0) || (bVar1 = true, p_Var2->_M_nxt == (_Hash_node_base *)0x0))
  {
    bVar1 = false;
    if (((this->parent).internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr != (element_type *)0x0) && (bVar1 = false, this->binder_type == REGULAR_BINDER)) {
      this_00 = shared_ptr<duckdb::Binder,_true>::operator->(&this->parent);
      bVar1 = CTEIsAlreadyBound(this_00,cte);
    }
  }
  return bVar1;
}

Assistant:

bool Binder::CTEIsAlreadyBound(CommonTableExpressionInfo &cte) {
	if (bound_ctes.find(cte) != bound_ctes.end()) {
		return true;
	}
	if (parent && binder_type == BinderType::REGULAR_BINDER) {
		return parent->CTEIsAlreadyBound(cte);
	}
	return false;
}